

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseline.cc
# Opt level: O0

void BASELINE::set_baseline_enabled(example *ec)

{
  bool bVar1;
  long *plVar2;
  feature_value *pfVar3;
  int __c;
  features_value_iterator *rhs;
  features_value_index_iterator *f;
  iterator __end1;
  iterator __begin1;
  features *__range1;
  features *fs;
  features_value_index_iterator *in_stack_ffffffffffffffc0;
  feature_value in_stack_ffffffffffffffcc;
  features *in_stack_ffffffffffffffd0;
  features_value_iterator in_stack_ffffffffffffffd8;
  
  features::begin((features *)in_stack_ffffffffffffffd8._begin);
  features::end((features *)in_stack_ffffffffffffffd8._begin);
  while( true ) {
    rhs = (features_value_iterator *)&stack0xffffffffffffffc8;
    bVar1 = features_value_iterator::operator!=
                      ((features_value_iterator *)&stack0xffffffffffffffd8,rhs);
    if (!bVar1) {
      features::push_back(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                          (feature_index)in_stack_ffffffffffffffc0);
      return;
    }
    in_stack_ffffffffffffffc0 =
         features_value_index_iterator::operator*
                   ((features_value_index_iterator *)&stack0xffffffffffffffd8);
    plVar2 = (long *)features_value_index_iterator::index(in_stack_ffffffffffffffc0,(char *)rhs,__c)
    ;
    if (*plVar2 == 0x54d) break;
    features_value_index_iterator::operator++(in_stack_ffffffffffffffc0);
  }
  pfVar3 = features_value_iterator::value(&in_stack_ffffffffffffffc0->super_features_value_iterator)
  ;
  *pfVar3 = 1.0;
  return;
}

Assistant:

void set_baseline_enabled(example* ec)
{
  auto& fs = ec->feature_space[message_namespace];
  for (auto& f : fs)
  {
    if (f.index() == baseline_enabled_idx)
    {
      f.value() = 1;
      return;
    }
  }
  // if not found, push new feature
  fs.push_back(1, baseline_enabled_idx);
}